

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O2

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
          (cmGeneratorExpressionDAGChecker *this,cmGeneratorTarget *tgt)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  cmGeneratorExpressionDAGChecker *pcVar4;
  char *prop;
  char *local_18;
  
  do {
    pcVar4 = this;
    this = pcVar4->Parent;
  } while (pcVar4->Parent != (cmGeneratorExpressionDAGChecker *)0x0);
  pcVar3 = (pcVar4->Property)._M_dataplus._M_p;
  local_18 = pcVar3;
  if (tgt == (cmGeneratorTarget *)0x0) {
    iVar2 = strcmp(pcVar3,"LINK_LIBRARIES");
    if (iVar2 == 0) {
      return true;
    }
    iVar2 = strcmp(pcVar3,"LINK_INTERFACE_LIBRARIES");
    if (iVar2 == 0) {
      return true;
    }
    iVar2 = strcmp(pcVar3,"IMPORTED_LINK_INTERFACE_LIBRARIES");
    if (iVar2 == 0) {
      return true;
    }
    bVar1 = cmHasLiteralPrefix<char_const*,26ul>(&local_18,(char (*) [26])0x48a343);
    if (bVar1) {
      return true;
    }
    bVar1 = cmHasLiteralPrefix<char_const*,35ul>
                      (&local_18,(char (*) [35])"IMPORTED_LINK_INTERFACE_LIBRARIES_");
    if (bVar1) {
      return true;
    }
    pcVar3 = "INTERFACE_LINK_LIBRARIES";
  }
  else {
    if (pcVar4->Target != tgt) {
      return false;
    }
    pcVar3 = "LINK_LIBRARIES";
  }
  iVar2 = strcmp(local_18,pcVar3);
  return iVar2 == 0;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(
  cmGeneratorTarget const* tgt)
{
  const cmGeneratorExpressionDAGChecker* top = this;
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    top = parent;
    parent = parent->Parent;
  }

  const char* prop = top->Property.c_str();

  if (tgt) {
    return top->Target == tgt && strcmp(prop, "LINK_LIBRARIES") == 0;
  }

  return (strcmp(prop, "LINK_LIBRARIES") == 0 ||
          strcmp(prop, "LINK_INTERFACE_LIBRARIES") == 0 ||
          strcmp(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES") == 0 ||
          cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES_") ||
          cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES_")) ||
    strcmp(prop, "INTERFACE_LINK_LIBRARIES") == 0;
}